

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.h
# Opt level: O1

shared_ptr<Expr> __thiscall Parser::factor(Parser *this)

{
  shared_ptr<Token> *__args;
  int iVar1;
  element_type *peVar2;
  element_type *w;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  undefined8 uVar4;
  long *plVar5;
  size_type *psVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_07;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_08;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_09;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_10;
  Parser *in_RSI;
  shared_ptr<Expr> sVar8;
  shared_ptr<Access> sVar9;
  shared_ptr<Expr> x;
  shared_ptr<Id> id;
  string s;
  element_type *local_e8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_e0;
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [24];
  undefined1 local_a0 [16];
  undefined1 local_90 [24];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_78;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_70;
  _Base_ptr local_68;
  string local_60;
  string local_40;
  
  _Stack_e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  __args = &in_RSI->look;
  peVar2 = (in_RSI->look).super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  iVar1 = peVar2->tag;
  if (iVar1 < 0x10e) {
    if (iVar1 == 0x28) {
      move(in_RSI);
      boolean((Parser *)local_c8);
      uVar4 = local_c8._8_8_;
      local_e8 = (element_type *)local_c8._0_8_;
      _Var7._M_pi = _Stack_e0._M_pi;
      local_c8._0_8_ = (element_type *)0x0;
      local_c8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      _Stack_e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar4;
      if (_Var7._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var7._M_pi);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_);
      }
      match(in_RSI,0x29);
      _Var7._M_pi = extraout_RDX_00;
    }
    else {
      if (iVar1 != 0x106) {
        if (iVar1 == 0x108) {
          (**peVar2->_vptr_Token)(local_c8);
          w = (in_RSI->top).super___shared_ptr<Env,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          local_70._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               (in_RSI->look).super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          local_68 = (_Base_ptr)
                     (in_RSI->look).super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi;
          if (local_68 != (_Base_ptr)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(int *)&local_68->_M_parent = *(int *)&local_68->_M_parent + 1;
              UNLOCK();
            }
            else {
              *(int *)&local_68->_M_parent = *(int *)&local_68->_M_parent + 1;
            }
          }
          Env::get((Env *)local_d8,(shared_ptr<Token> *)w);
          if (local_68 != (_Base_ptr)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68);
          }
          if ((element_type *)local_d8._0_8_ == (element_type *)0x0) {
            (**((__args->super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->_vptr_Token
            )(local_a0);
            plVar5 = (long *)std::__cxx11::string::append(local_a0);
            psVar6 = (size_type *)(plVar5 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar5 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar6) {
              local_60.field_2._M_allocated_capacity = *psVar6;
              local_60.field_2._8_8_ = plVar5[3];
              local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
            }
            else {
              local_60.field_2._M_allocated_capacity = *psVar6;
              local_60._M_dataplus._M_p = (pointer)*plVar5;
            }
            local_60._M_string_length = plVar5[1];
            *plVar5 = (long)psVar6;
            plVar5[1] = 0;
            *(undefined1 *)(plVar5 + 2) = 0;
            error(in_RSI,&local_60);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_60._M_dataplus._M_p != &local_60.field_2) {
              operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
            }
            if ((element_type *)local_a0._0_8_ != (element_type *)local_90) {
              operator_delete((void *)local_a0._0_8_,
                              (ulong)((long)&(((shared_ptr<Env> *)local_90._0_8_)->
                                             super___shared_ptr<Env,_(__gnu_cxx::_Lock_policy)2>).
                                             _M_ptr + 1));
            }
          }
          move(in_RSI);
          uVar4 = local_d8._8_8_;
          if (((__args->super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->tag == 0x5b)
          {
            local_90._16_8_ = local_d8._0_8_;
            local_78 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                *(_Atomic_word *)(local_d8._8_8_ + 8) = *(_Atomic_word *)(local_d8._8_8_ + 8) + 1;
                UNLOCK();
              }
              else {
                *(_Atomic_word *)(local_d8._8_8_ + 8) = *(_Atomic_word *)(local_d8._8_8_ + 8) + 1;
              }
            }
            sVar9 = offset((Parser *)local_a0,(shared_ptr<Id> *)in_RSI);
            uVar4 = local_a0._8_8_;
            _Var7 = sVar9.super___shared_ptr<Access,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
            (this->top).super___shared_ptr<Env,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)local_a0._0_8_;
            (this->top).super___shared_ptr<Env,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            local_a0._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            (this->top).super___shared_ptr<Env,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar4;
            local_a0._0_8_ = (element_type *)0x0;
            if (local_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_78);
              _Var7._M_pi = extraout_RDX_08;
            }
          }
          else {
            (this->top).super___shared_ptr<Env,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)local_d8._0_8_;
            (this->top).super___shared_ptr<Env,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            local_d8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            (this->top).super___shared_ptr<Env,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar4;
            local_d8._0_8_ = (element_type *)0x0;
            _Var7._M_pi = extraout_RDX_07;
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_);
            _Var7._M_pi = extraout_RDX_09;
          }
          if ((element_type *)local_c8._0_8_ != (element_type *)local_b8) {
            operator_delete((void *)local_c8._0_8_,
                            (ulong)((long)&(((shared_ptr<Env> *)local_b8._0_8_)->
                                           super___shared_ptr<Env,_(__gnu_cxx::_Lock_policy)2>).
                                           _M_ptr + 1));
            _Var7._M_pi = extraout_RDX_10;
          }
          goto LAB_0010dc00;
        }
LAB_0010daf1:
        local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"syntax error","");
        error(in_RSI,&local_40);
        _Var7._M_pi = extraout_RDX_02;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_40._M_dataplus._M_p != &local_40.field_2) {
          operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
          _Var7._M_pi = extraout_RDX_03;
        }
        (this->top).super___shared_ptr<Env,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
        ;
        (this->top).super___shared_ptr<Env,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        goto LAB_0010dc00;
      }
      local_e8 = (element_type *)
                 Constant::False.super___shared_ptr<Constant,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&_Stack_e0,
                 &Constant::False.super___shared_ptr<Constant,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      move(in_RSI);
      _Var7._M_pi = extraout_RDX_04;
    }
  }
  else if (iVar1 == 0x10e) {
    local_c8._0_8_ = (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<Constant,std::allocator<Constant>,std::shared_ptr<Token>&,std::shared_ptr<Type>&>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_c8 + 8),(Constant **)local_c8,
               (allocator<Constant> *)local_a0,__args,&Type::Int);
    std::__shared_ptr<Constant,(__gnu_cxx::_Lock_policy)2>::
    _M_enable_shared_from_this_with<Constant,Constant>
              ((__shared_ptr<Constant,(__gnu_cxx::_Lock_policy)2> *)local_c8,
               (Constant *)local_c8._0_8_);
    uVar4 = local_c8._8_8_;
    local_e8 = (element_type *)local_c8._0_8_;
    _Var7._M_pi = _Stack_e0._M_pi;
    local_c8._0_8_ = (element_type *)0x0;
    local_c8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    _Stack_e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar4;
    if (_Var7._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var7._M_pi);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_);
    }
    move(in_RSI);
    _Var7._M_pi = extraout_RDX_01;
  }
  else if (iVar1 == 0x110) {
    local_c8._0_8_ = (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<Constant,std::allocator<Constant>,std::shared_ptr<Token>&,std::shared_ptr<Type>&>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_c8 + 8),(Constant **)local_c8,
               (allocator<Constant> *)local_a0,__args,&Type::Float);
    std::__shared_ptr<Constant,(__gnu_cxx::_Lock_policy)2>::
    _M_enable_shared_from_this_with<Constant,Constant>
              ((__shared_ptr<Constant,(__gnu_cxx::_Lock_policy)2> *)local_c8,
               (Constant *)local_c8._0_8_);
    uVar4 = local_c8._8_8_;
    local_e8 = (element_type *)local_c8._0_8_;
    _Var7._M_pi = _Stack_e0._M_pi;
    local_c8._0_8_ = (element_type *)0x0;
    local_c8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    _Stack_e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar4;
    if (_Var7._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var7._M_pi);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_);
    }
    move(in_RSI);
    _Var7._M_pi = extraout_RDX_05;
  }
  else {
    if (iVar1 != 0x112) goto LAB_0010daf1;
    local_e8 = (element_type *)
               Constant::True.super___shared_ptr<Constant,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&_Stack_e0,
               &Constant::True.super___shared_ptr<Constant,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
    ;
    move(in_RSI);
    _Var7._M_pi = extraout_RDX;
  }
  _Var3._M_pi = _Stack_e0._M_pi;
  (this->top).super___shared_ptr<Env,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_e8;
  (this->top).super___shared_ptr<Env,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  _Stack_e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->top).super___shared_ptr<Env,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var3._M_pi;
LAB_0010dc00:
  if (_Stack_e0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_e0._M_pi);
    _Var7._M_pi = extraout_RDX_06;
  }
  sVar8.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var7._M_pi;
  sVar8.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<Expr>)sVar8.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Expr> factor() {
		std::shared_ptr<Expr> x;
		switch (look->tag) {
		case '(':
			move(); x = boolean(); match(')');
			return x;
			break;
		case NUM:
			x = std::make_shared<Constant>(look, Type::Int);
			move(); return x;
			break;
		case REAL:
			x = std::make_shared<Constant>(look, Type::Float);
			move(); return x;
			break;
		case TRUE:
			x = Constant::True;
			move(); return x;
			break;
		case FALSE:
			x = Constant::False;
			move(); return x;
			break;
		case ID:
			{
				std::string s = look->toString();
				std::shared_ptr<Id> id = top->get(look);
				if (id == nullptr) {
					error(look->toString() + " undeclared");
				}
				move();
				if (look->tag != '[') return id;
				else return offset(id);
			}
			break;
		default:
			error("syntax error");
			return nullptr;
			break;
		}
		
		return nullptr;
	}